

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.h
# Opt level: O0

void __thiscall decoder::Viterbi::Viterbi(Viterbi *this)

{
  correct_convolutional_sse *pcVar1;
  undefined8 *in_RDI;
  uint16_t poly [2];
  polynomial_t *poly_00;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  poly_00 = (polynomial_t *)(in_RDI + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x103b00);
  pcVar1 = correct_convolutional_sse_create
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,poly_00);
  *in_RDI = pcVar1;
  return;
}

Assistant:

Viterbi() {
    // Initialize Viterbi decoder.
    // Polynomials are not referenced after creation
    // so can be referenced from the stack.
    uint16_t poly[2] = { (uint16_t)0x4f, (uint16_t)0x6d };
#ifdef HAVE_SSE
    v_ = correct_convolutional_sse_create(2, 7, poly);
#else
    v_ = correct_convolutional_create(2, 7, poly);
#endif
  }